

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavApplyItemToResult(ImGuiNavItemData *result)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  float fVar6;
  float fVar7;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  result->Window = pIVar4;
  result->ID = (pIVar5->LastItemData).ID;
  result->FocusScopeId = pIVar5->CurrentFocusScopeId;
  result->InFlags = (pIVar5->LastItemData).InFlags;
  IVar1 = (pIVar4->DC).CursorStartPos;
  IVar2 = (pIVar5->LastItemData).NavRect.Min;
  IVar3 = (pIVar5->LastItemData).NavRect.Max;
  fVar6 = IVar1.x;
  fVar7 = IVar1.y;
  (result->RectRel).Min.x = IVar2.x - fVar6;
  (result->RectRel).Min.y = IVar2.y - fVar7;
  (result->RectRel).Max.x = IVar3.x - fVar6;
  (result->RectRel).Max.y = IVar3.y - fVar7;
  return;
}

Assistant:

static void ImGui::NavApplyItemToResult(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    result->Window = window;
    result->ID = g.LastItemData.ID;
    result->FocusScopeId = g.CurrentFocusScopeId;
    result->InFlags = g.LastItemData.InFlags;
    result->RectRel = WindowRectAbsToRel(window, g.LastItemData.NavRect);
}